

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  short sVar5;
  NameContext *pNC;
  Parse *pParse;
  sqlite3 *psVar6;
  SrcList *pSVar7;
  IdList *pIVar8;
  Upsert *pUVar9;
  ExprList *pEList;
  Db *pDVar10;
  Schema *pSVar11;
  u8 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  FuncDef *pFunc;
  Expr *pEVar19;
  RenameToken *pRVar20;
  Select *pSVar21;
  Schema **ppSVar22;
  Table *pTVar23;
  ushort uVar24;
  ulong uVar25;
  int iVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  uint uVar30;
  uint uVar31;
  Expr *pEVar32;
  SrcList_item *pSVar33;
  long lVar34;
  char *zLeft;
  char **ppcVar35;
  Column *pCVar36;
  NameContext *pNVar37;
  Schema *pSVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  uint uVar42;
  IdList_item *pIVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  Walker w;
  int local_100;
  SrcList_item *local_f8;
  char *local_f0;
  NameContext *local_c0;
  Table **local_98;
  SrcList *local_78;
  undefined8 local_70;
  anon_union_8_3_c79b3df9_for_y *local_68;
  Walker local_60;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  bVar2 = pExpr->op;
  if (0x82 < bVar2) {
    if (bVar2 < 0x94) {
      if (bVar2 != 0x83) {
        if (bVar2 == 0x86) {
          pEVar32 = pExpr->pLeft;
          notValid(pParse,pNC,"the \".\" operator",0x20);
          pEVar19 = pExpr->pRight;
          if (pEVar19->op == ';') {
            pcVar29 = (char *)0x0;
          }
          else {
            pcVar29 = (pEVar32->u).zToken;
            pEVar32 = pEVar19->pLeft;
            pEVar19 = pEVar19->pRight;
          }
          pcVar28 = (pEVar32->u).zToken;
          local_f0 = (pEVar19->u).zToken;
          if (1 < pParse->eParseMode) {
            for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0; pRVar20 = pRVar20->pNext)
            {
              if ((Expr *)pRVar20->p == pEVar19) {
                pRVar20->p = pExpr;
                break;
              }
            }
            pRVar20 = pParse->pRename;
            if (pRVar20 != (RenameToken *)0x0) {
              do {
                if ((Expr *)pRVar20->p == pEVar32) {
                  pRVar20->p = &pExpr->y;
                  break;
                }
                pRVar20 = pRVar20->pNext;
              } while (pRVar20 != (RenameToken *)0x0);
            }
          }
          goto LAB_001718a8;
        }
        goto switchD_001714c5_caseD_2e;
      }
      goto switchD_001714c5_caseD_31;
    }
    if (bVar2 == 0x94) {
      notValid(pParse,pNC,"parameters",0x26);
      goto switchD_001714c5_caseD_2e;
    }
    if (bVar2 == 0xa0) goto switchD_001714c5_caseD_2d;
    if (bVar2 != 0xa1) goto switchD_001714c5_caseD_2e;
    pSVar21 = (pExpr->x).pSelect;
    uVar25 = 0;
    iVar13 = 0;
    if (pSVar21 != (Select *)0x0) {
      iVar13 = *(int *)&pSVar21->pEList;
    }
    psVar6 = pParse->db;
    uVar12 = psVar6->enc;
    uVar4 = pNC->ncFlags;
    pcVar29 = (pExpr->u).zToken;
    if (pcVar29 != (char *)0x0) {
      sVar18 = strlen(pcVar29);
      uVar25 = (ulong)((uint)sVar18 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(psVar6,pcVar29,iVar13,uVar12,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar44 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar29,-2,uVar12,'\0');
      bVar45 = pFunc == (FuncDef *)0x0;
      bVar41 = !bVar45;
    }
    else {
      bVar44 = pFunc->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar13 == 2) {
          iVar13 = exprProbability((Expr *)pSVar21->pSrc);
          pExpr->iTable = iVar13;
          if (iVar13 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
        }
        else {
          iVar13 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar13 = 0x800000;
          }
          pExpr->iTable = iVar13;
        }
      }
      iVar13 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNC->nErr = pNC->nErr + 1;
        }
        pExpr->op = 'r';
        return 1;
      }
      uVar42 = pFunc->funcFlags;
      if ((uVar42 & 0x2800) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar42 >> 0xb & 1) == 0) {
        notValid(pParse,pNC,"non-deterministic functions",0x22);
      }
      bVar45 = true;
      if ((pFunc->funcFlags & 0x40000) == 0) {
        bVar41 = true;
      }
      else {
        bVar46 = pParse->nested != '\0';
        bVar41 = sqlite3Config.bInternalFunctions != 0 || bVar46;
        if (sqlite3Config.bInternalFunctions == 0 && !bVar46) {
          pFunc = (FuncDef *)0x0;
        }
      }
    }
    if (1 < pParse->eParseMode) goto LAB_001725ea;
    if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
       ((pExpr->flags & 0x1000000) != 0)) {
      pcVar28 = "%.*s() may not be used as a window function";
      goto LAB_001725a9;
    }
    if ((bVar44) &&
       (((pNC->ncFlags & 1) == 0 ||
        ((bVar44 &&
         ((((pFunc->funcFlags & 0x10000) != 0 && ((pExpr->y).pTab == (Table *)0x0)) ||
          ((bVar44 && (((pNC->ncFlags >> 0xe & 1) == 0 && ((pExpr->y).pTab != (Table *)0x0))))))))))
       )) {
      if ((pFunc->funcFlags & 0x10000) == 0) {
        pcVar28 = "window";
        if ((pExpr->y).pTab == (Table *)0x0) {
          pcVar28 = "aggregate";
        }
      }
      else {
        pcVar28 = "window";
      }
      bVar44 = false;
      sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar28,uVar25,pcVar29);
LAB_001725bf:
      pNC->nErr = pNC->nErr + 1;
    }
    else {
      if ((!bVar41) && ((pParse->db->init).busy == '\0')) {
        pcVar28 = "no such function: %.*s";
LAB_001725a9:
        sqlite3ErrorMsg(pParse,pcVar28,uVar25,pcVar29);
        goto LAB_001725bf;
      }
      if (!bVar45) {
        pcVar28 = "wrong number of arguments to function %.*s()";
        goto LAB_001725a9;
      }
    }
    if (bVar44) {
      pNC->ncFlags = pNC->ncFlags & 0xbfff - ((pExpr->y).pTab == (Table *)0x0);
      bVar44 = true;
    }
    else {
      bVar44 = false;
    }
LAB_001725ea:
    sqlite3WalkExprList(pWalker,(ExprList *)pSVar21);
    if (!bVar44) {
      return 1;
    }
    if ((pExpr->y).pWin == (Window *)0x0) {
      pExpr->op = 0xa3;
      pExpr->op2 = '\0';
      pNVar37 = pNC;
      do {
        local_78 = pNVar37->pSrcList;
        local_60.xExprCallback = exprSrcCount;
        local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_70 = 0;
        local_60.u.pNC = (NameContext *)&local_78;
        sqlite3WalkExprList(&local_60,(pExpr->x).pList);
        if ((0 < (int)local_70) || (local_70._4_4_ == 0)) {
          pNVar37->ncFlags = (ushort)pFunc->funcFlags & 0x1000 | pNVar37->ncFlags | 0x10;
          break;
        }
        pExpr->op2 = pExpr->op2 + '\x01';
        pNVar37 = pNVar37->pNext;
      } while (pNVar37 != (NameContext *)0x0);
    }
    else {
      pSVar21 = pNC->pWinSelect;
      sqlite3WindowUpdate(pParse,pSVar21->pWinDefn,(pExpr->y).pWin,pFunc);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
      pEVar32 = ((pExpr->y).pWin)->pFilter;
      if (pEVar32 != (Expr *)0x0) {
        walkExpr(pWalker,pEVar32);
      }
      if ((pSVar21->pWin == (Window *)0x0) ||
         (iVar13 = sqlite3WindowCompare(pParse,pSVar21->pWin,(pExpr->y).pWin), iVar13 == 0)) {
        ((pExpr->y).pWin)->pNextWin = pSVar21->pWin;
        pSVar21->pWin = (Window *)pExpr->y;
      }
      pbVar1 = (byte *)((long)&pNC->ncFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    pNC->ncFlags = pNC->ncFlags | uVar4 & 0x4001;
    return 1;
  }
  switch(bVar2) {
  case 0x2d:
    goto switchD_001714c5_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_001714c5_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_001714c5_caseD_30;
  case 0x31:
    break;
  case 0x3b:
    local_f0 = (pExpr->u).zToken;
    pcVar29 = (char *)0x0;
    pcVar28 = (char *)0x0;
LAB_001718a8:
    psVar6 = pParse->db;
    pExpr->iTable = -1;
    iVar13 = 0;
    if ((pcVar29 == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
      pSVar38 = (Schema *)0x0;
      pcVar29 = (char *)0x0;
    }
    else {
      iVar16 = psVar6->nDb;
      if ((long)iVar16 < 1) {
        pSVar38 = (Schema *)0x0;
      }
      else {
        pDVar10 = psVar6->aDb;
        pSVar38 = (Schema *)0x0;
        lVar39 = 0;
        do {
          iVar17 = sqlite3StrICmp(*(char **)((long)&pDVar10->zDbSName + lVar39),pcVar29);
          if (iVar17 == 0) {
            pSVar38 = *(Schema **)((long)&pDVar10->pSchema + lVar39);
            break;
          }
          lVar39 = lVar39 + 0x20;
        } while ((long)iVar16 * 0x20 != lVar39);
      }
    }
    local_68 = &pExpr->y;
    local_98 = &pParse->pTriggerTab;
    uVar12 = 0xa2;
    local_f8 = (SrcList_item *)0x0;
    iVar16 = 0;
    local_100 = 0;
    local_c0 = pNC;
    do {
      pSVar7 = local_c0->pSrcList;
      if (pSVar7 != (SrcList *)0x0) {
        iVar17 = pSVar7->nSrc;
        if (0 < iVar17) {
          pSVar33 = pSVar7->a;
          iVar26 = 0;
          do {
            pTVar23 = pSVar33->pTab;
            pSVar21 = pSVar33->pSelect;
            if ((pSVar21 == (Select *)0x0) || ((pSVar21->selFlags & 0x800) == 0)) {
LAB_00171a22:
              if ((pcVar29 == (char *)0x0) || (pTVar23->pSchema == pSVar38)) {
                if (pcVar28 != (char *)0x0) {
                  pcVar27 = pSVar33->zAlias;
                  zLeft = pcVar27;
                  if (pcVar27 == (char *)0x0) {
                    zLeft = pTVar23->zName;
                  }
                  iVar14 = sqlite3StrICmp(zLeft,pcVar28);
                  if (iVar14 != 0) goto LAB_00171beb;
                  if ((pcVar27 != (char *)0x0) && (1 < pParse->eParseMode)) {
                    for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0;
                        pRVar20 = pRVar20->pNext) {
                      if ((anon_union_8_3_c79b3df9_for_y *)pRVar20->p == local_68) {
                        pRVar20->p = (void *)0x0;
                        break;
                      }
                    }
                  }
                }
                iVar14 = iVar16 + 1;
                if (iVar16 == 0) {
                  local_f8 = pSVar33;
                }
                sVar5 = pTVar23->nCol;
                iVar16 = iVar14;
                if (0 < sVar5) {
                  pCVar36 = pTVar23->aCol;
                  iVar14 = 0;
                  do {
                    iVar15 = sqlite3StrICmp(pCVar36->zName,local_f0);
                    if (iVar15 == 0) {
                      if (local_100 != 1) {
LAB_00171ba6:
                        local_100 = local_100 + 1;
                        if (iVar14 == pTVar23->iPKey) {
                          iVar14 = 0xffff;
                        }
                        pExpr->iColumn = (ynVar)iVar14;
                        local_f8 = pSVar33;
                        break;
                      }
                      if (((pSVar33->fg).jointype & 4) == 0) {
                        pIVar8 = pSVar33->pUsing;
                        if ((pIVar8 == (IdList *)0x0) ||
                           (uVar25 = (ulong)pIVar8->nId, (long)uVar25 < 1)) goto LAB_00171ba6;
                        pIVar43 = pIVar8->a;
                        iVar15 = sqlite3StrICmp(pIVar43->zName,local_f0);
                        if (iVar15 != 0) {
                          uVar40 = 0;
                          do {
                            pIVar43 = pIVar43 + 1;
                            if (uVar25 - 1 == uVar40) goto LAB_00171ba6;
                            iVar15 = sqlite3StrICmp(pIVar43->zName,local_f0);
                            uVar40 = uVar40 + 1;
                          } while (iVar15 != 0);
                          if (uVar25 <= uVar40) goto LAB_00171ba6;
                        }
                      }
                    }
                    iVar14 = iVar14 + 1;
                    pCVar36 = pCVar36 + 1;
                  } while (iVar14 != sVar5);
                }
              }
            }
            else {
              lVar39 = (long)pSVar21->pEList->nExpr;
              bVar41 = false;
              if (0 < lVar39) {
                ppcVar35 = &pSVar21->pEList->a[0].zSpan;
                lVar34 = 0;
                do {
                  iVar14 = sqlite3MatchSpanName(*ppcVar35,local_f0,pcVar28,pcVar29);
                  if (iVar14 != 0) {
                    local_100 = local_100 + 1;
                    pExpr->iColumn = (ynVar)lVar34;
                    iVar16 = 2;
                    bVar41 = true;
                    local_f8 = pSVar33;
                  }
                  lVar34 = lVar34 + 1;
                  ppcVar35 = ppcVar35 + 4;
                } while (lVar39 != lVar34);
              }
              if (pcVar28 != (char *)0x0 && !bVar41) goto LAB_00171a22;
            }
LAB_00171beb:
            iVar26 = iVar26 + 1;
            pSVar33 = pSVar33 + 1;
          } while (iVar26 != iVar17);
        }
        if (local_f8 == (SrcList_item *)0x0) {
          local_f8 = (SrcList_item *)0x0;
        }
        else {
          pExpr->iTable = local_f8->iCursor;
          pTVar23 = local_f8->pTab;
          (pExpr->y).pTab = pTVar23;
          if (((local_f8->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          pSVar38 = pTVar23->pSchema;
        }
      }
      if (iVar16 == 0 && (pcVar28 != (char *)0x0 && pcVar29 == (char *)0x0)) {
        pTVar23 = *local_98;
        if (pTVar23 == (Table *)0x0) {
          pTVar23 = (Table *)0x0;
        }
        else {
          uVar3 = pParse->eTriggerOp;
          if (uVar3 == 'y') {
LAB_00171c92:
            iVar17 = sqlite3StrICmp("old",pcVar28);
            iVar16 = 0;
            if (iVar17 == 0) {
LAB_00171cc0:
              pExpr->iTable = iVar16;
              goto LAB_00171cd1;
            }
          }
          else {
            iVar16 = sqlite3StrICmp("new",pcVar28);
            if (iVar16 == 0) {
              iVar16 = 1;
              goto LAB_00171cc0;
            }
            if (uVar3 != 'x') goto LAB_00171c92;
          }
          pTVar23 = (Table *)0x0;
        }
LAB_00171cd1:
        if ((((local_c0->ncFlags & 0x200) != 0) &&
            (pUVar9 = (local_c0->uNC).pUpsert, pUVar9 != (Upsert *)0x0)) &&
           (iVar16 = sqlite3StrICmp("excluded",pcVar28), iVar16 == 0)) {
          pTVar23 = pUVar9->pUpsertSrc->a[0].pTab;
          pExpr->iTable = 2;
        }
        if (pTVar23 == (Table *)0x0) {
          iVar16 = 0;
        }
        else {
          pSVar38 = pTVar23->pSchema;
          uVar42 = (uint)pTVar23->nCol;
          if ((int)uVar42 < 1) {
            uVar31 = 0;
          }
          else {
            pCVar36 = pTVar23->aCol;
            uVar30 = 0;
            do {
              iVar16 = sqlite3StrICmp(pCVar36->zName,local_f0);
              if (iVar16 == 0) {
                uVar31 = uVar30;
                if ((int)pTVar23->iPKey == uVar30) {
                  uVar31 = 0xffffffff;
                }
                break;
              }
              uVar30 = uVar30 + 1;
              pCVar36 = pCVar36 + 1;
              uVar31 = uVar42;
            } while (uVar42 != uVar30);
          }
          if (((int)uVar42 <= (int)uVar31) && (iVar16 = sqlite3IsRowid(local_f0), iVar16 != 0)) {
            uVar31 = uVar31 | -(uint)((pTVar23->tabFlags & 0x40) == 0);
          }
          iVar16 = 1;
          if ((int)uVar31 < (int)uVar42) {
            local_100 = local_100 + 1;
            if (pExpr->iTable == 2) {
              if (pParse->eParseMode < 2) {
                pExpr->iTable = uVar31 + ((local_c0->uNC).pUpsert)->regData;
                pbVar1 = (byte *)((long)&pExpr->flags + 2);
                *pbVar1 = *pbVar1 | 0x40;
                uVar12 = 0xa8;
              }
              else {
                pExpr->iColumn = (ynVar)uVar31;
                (pExpr->y).pTab = pTVar23;
                uVar12 = 0xa2;
              }
            }
            else {
              if ((int)uVar31 < 0) {
                pExpr->affinity = 'D';
              }
              else {
                uVar42 = 1 << ((byte)uVar31 & 0x1f);
                if (0x1f < (int)uVar31) {
                  uVar42 = 0xffffffff;
                }
                if (pExpr->iTable == 0) {
                  pParse->oldmask = pParse->oldmask | uVar42;
                }
                else {
                  pParse->newmask = pParse->newmask | uVar42;
                }
              }
              (pExpr->y).pTab = pTVar23;
              pExpr->iColumn = (ynVar)uVar31;
              uVar12 = 'M';
            }
          }
        }
      }
      if (((local_100 == 0) && (iVar16 == 1)) &&
         ((local_f8 != (SrcList_item *)0x0 &&
          (((local_100 = 0, (local_c0->ncFlags & 0x20) == 0 &&
            (iVar17 = sqlite3IsRowid(local_f0), iVar17 != 0)) &&
           ((local_f8->pTab->tabFlags & 0x40) == 0)))))) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'D';
        local_100 = 1;
      }
      if (((pcVar28 == (char *)0x0) && (local_100 == 0)) && ((local_c0->ncFlags & 0x80) != 0)) {
        pEList = (local_c0->uNC).pEList;
        if (pEList->nExpr < 1) {
          local_100 = 0;
        }
        else {
          lVar39 = 0;
          local_100 = 0;
          do {
            pcVar27 = pEList->a[lVar39].zName;
            bVar41 = true;
            if (pcVar27 == (char *)0x0) {
              iVar17 = 0;
            }
            else {
              iVar17 = sqlite3StrICmp(pcVar27,local_f0);
              if (iVar17 == 0) {
                pEVar32 = pEList->a[lVar39].pExpr;
                if (((local_c0->ncFlags & 1) == 0) && ((pEVar32->flags & 0x10) != 0)) {
                  bVar41 = false;
                  sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar27);
                  iVar17 = 1;
                }
                else {
                  if (((local_c0->ncFlags >> 0xe & 1) == 0) && ((pEVar32->flags & 0x8000) != 0)) {
                    sqlite3ErrorMsg(pParse,"misuse of aliased window function %s",pcVar27);
LAB_0017201c:
                    iVar17 = 1;
                  }
                  else {
                    uVar3 = pEVar32->op;
                    if (uVar3 == 0xa8) {
                      uVar3 = pEVar32->op2;
                    }
                    if (uVar3 == 0x83) {
                      pSVar21 = (pEVar32->x).pSelect;
LAB_00171f78:
                      if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr != 1) {
                        sqlite3ErrorMsg(pParse,"row value misused");
                        goto LAB_0017201c;
                      }
                    }
                    else if (uVar3 == 0xa9) {
                      pSVar21 = (Select *)&pEVar32->x;
                      goto LAB_00171f78;
                    }
                    resolveAlias(pParse,pEList,(int)lVar39,pExpr,"",iVar13);
                    local_100 = 1;
                    iVar17 = 0x16;
                    if (1 < pParse->eParseMode) {
                      for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0;
                          pRVar20 = pRVar20->pNext) {
                        if ((Expr *)pRVar20->p == pExpr) {
                          pRVar20->p = (void *)0x0;
                          break;
                        }
                      }
                      local_f8 = (SrcList_item *)0x0;
                      bVar41 = false;
                      goto LAB_0017203e;
                    }
                    local_f8 = (SrcList_item *)0x0;
                  }
                  bVar41 = false;
                }
              }
              else {
                iVar17 = 0;
              }
            }
LAB_0017203e:
            if (!bVar41) goto LAB_001720b4;
            lVar39 = lVar39 + 1;
          } while (lVar39 < pEList->nExpr);
        }
      }
      iVar17 = 5;
      if (local_100 == 0) {
        local_c0 = local_c0->pNext;
        iVar13 = iVar13 + 1;
        iVar17 = 0;
        local_100 = 0;
      }
LAB_001720b4:
      if (iVar17 != 0) {
        if (iVar17 != 5) {
          if (iVar17 != 0x16) {
            return 2;
          }
          goto LAB_001724d2;
        }
        break;
      }
    } while (local_c0 != (NameContext *)0x0);
    if ((pcVar28 == (char *)0x0) && (local_100 == 0)) {
      if ((pExpr->flags & 0x40) != 0) {
        sqlite3_log(0x1c,"double-quoted string literal: \"%w\"",local_f0);
        pExpr->op = 'n';
        (pExpr->y).pTab = (Table *)0x0;
        return 1;
      }
      iVar13 = sqlite3ExprIdToTrueFalse(pExpr);
      if (iVar13 != 0) {
        return 1;
      }
    }
    if (local_100 != 1) {
      pcVar27 = "ambiguous column name";
      if (local_100 == 0) {
        pcVar27 = "no such column";
      }
      if (pcVar29 == (char *)0x0) {
        if (pcVar28 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"%s: %s",pcVar27,local_f0);
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar27,pcVar28,local_f0);
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar27,pcVar29,pcVar28,local_f0);
      }
      pParse->checkSchema = '\x01';
      pNC->nErr = pNC->nErr + 1;
    }
    uVar4 = pExpr->iColumn;
    if ((-1 < (short)uVar4) && (local_f8 != (SrcList_item *)0x0)) {
      uVar24 = 0x3f;
      if (uVar4 < 0x3f) {
        uVar24 = uVar4;
      }
      local_f8->colUsed = local_f8->colUsed | 1L << ((byte)uVar24 & 0x3f);
    }
    if (pExpr->pLeft != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar6,pExpr->pLeft);
    }
    pExpr->pLeft = (Expr *)0x0;
    if (pExpr->pRight != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar6,pExpr->pRight);
    }
    pExpr->pRight = (Expr *)0x0;
    pExpr->op = uVar12;
    pbVar1 = (byte *)((long)&pExpr->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
LAB_001724d2:
    if (local_100 != 1) {
      return 2;
    }
    if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
      if (pSVar38 == (Schema *)0x0) {
        iVar13 = -1000000;
      }
      else {
        iVar13 = -1;
        ppSVar22 = &pParse->db->aDb->pSchema;
        do {
          iVar13 = iVar13 + 1;
          pSVar11 = *ppSVar22;
          ppSVar22 = ppSVar22 + 4;
        } while (pSVar11 != pSVar38);
      }
      if (-1 < iVar13) {
        if (pExpr->op == 'M') {
LAB_00172772:
          pTVar23 = *local_98;
        }
        else {
          lVar39 = (long)local_c0->pSrcList->nSrc;
          if (lVar39 < 1) {
            pTVar23 = (Table *)0x0;
          }
          else {
            local_98 = &local_c0->pSrcList->a[0].pTab;
            pTVar23 = (Table *)0x0;
            do {
              if (pExpr->iTable == *(int *)(local_98 + 4)) goto LAB_00172772;
              local_98 = local_98 + 0xe;
              lVar39 = lVar39 + -1;
            } while (lVar39 != 0);
          }
        }
        if (pTVar23 != (Table *)0x0) {
          lVar39 = (long)pExpr->iColumn;
          if ((pExpr->iColumn < 0) && (lVar39 = (long)pTVar23->iPKey, lVar39 < 0)) {
            pcVar29 = "ROWID";
          }
          else {
            pcVar29 = pTVar23->aCol[lVar39].zName;
          }
          iVar13 = sqlite3AuthReadCol(pParse,pTVar23->zName,pcVar29,iVar13);
          if (iVar13 == 2) {
            pExpr->op = 'r';
          }
        }
      }
    }
    pNC->nRef = pNC->nRef + 1;
    while (local_c0 != pNC) {
      pNC = pNC->pNext;
      pNC->nRef = pNC->nRef + 1;
    }
    return 1;
  default:
    if (bVar2 != 0x14) goto switchD_001714c5_caseD_2e;
  }
switchD_001714c5_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar13 = pNC->nRef;
    notValid(pParse,pNC,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar13 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
    }
  }
  goto switchD_001714c5_caseD_2e;
switchD_001714c5_caseD_2d:
  pEVar32 = pExpr->pRight;
  bVar41 = true;
  if (pEVar32->op == ';') {
    iVar13 = resolveExprStep(pWalker,pEVar32);
    if (iVar13 == 2) {
      pEVar32 = (Expr *)0x2;
      bVar41 = false;
    }
    else if (pEVar32->op == 0x9f) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa7;
      bVar41 = false;
      pEVar32 = (Expr *)0x0;
    }
  }
  if (!bVar41) {
    return (int)pEVar32;
  }
switchD_001714c5_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_001714c5_caseD_2e;
  pEVar32 = pExpr->pLeft;
  uVar12 = pEVar32->op;
  if (uVar12 == 0xa8) {
    uVar12 = pEVar32->op2;
  }
  if (uVar12 == 0x83) {
    pSVar21 = (pEVar32->x).pSelect;
LAB_0017170a:
    iVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
  }
  else {
    iVar13 = 1;
    if (uVar12 == 0xa9) {
      pSVar21 = (Select *)&pEVar32->x;
      goto LAB_0017170a;
    }
  }
  if (pExpr->op == '0') {
    pEVar32 = ((pExpr->x).pList)->a[0].pExpr;
    uVar12 = pEVar32->op;
    if (uVar12 == 0xa8) {
      uVar12 = pEVar32->op2;
    }
    if (uVar12 == 0x83) {
      pSVar21 = (pEVar32->x).pSelect;
LAB_0017177f:
      iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
    }
    else {
      iVar16 = 1;
      if (uVar12 == 0xa9) {
        pSVar21 = (Select *)&pEVar32->x;
        goto LAB_0017177f;
      }
    }
    if (iVar16 == iVar13) {
      pEVar32 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_0017178c;
    }
  }
  else {
    pEVar32 = pExpr->pRight;
LAB_0017178c:
    uVar12 = pEVar32->op;
    if (uVar12 == 0xa8) {
      uVar12 = pEVar32->op2;
    }
    if (uVar12 == 0x83) {
      pSVar21 = (pEVar32->x).pSelect;
    }
    else {
      iVar16 = 1;
      if (uVar12 != 0xa9) goto LAB_001717ba;
      pSVar21 = (Select *)&pEVar32->x;
    }
    iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
  }
LAB_001717ba:
  if (iVar13 != iVar16) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_001714c5_caseD_2e:
  iVar13 = 2;
  if (pParse->nErr == 0) {
    iVar13 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar13;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */
      int savedAllowFlags = (pNC->ncFlags & (NC_AllowAgg | NC_AllowWin));

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
          /* Window functions may not be arguments of aggregate functions.
          ** Or arguments of other window functions. But aggregate functions
          ** may be arguments for window functions.  */
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(NC_AllowWin | (!pExpr->y.pWin ? NC_AllowAgg : 0));
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_HasWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
        }
        pNC->ncFlags |= savedAllowFlags;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight;
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( (pRight = pExpr->pRight)->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}